

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O0

void ReadFromStream(AddrMan *addr,DataStream *ssPeers)

{
  long lVar1;
  long in_FS_OFFSET;
  bool in_stack_00000017;
  AddrMan *in_stack_00000018;
  DataStream *in_stack_00000020;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (anonymous_namespace)::DeserializeDB<DataStream,AddrMan&>
            (in_stack_00000020,in_stack_00000018,in_stack_00000017);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ReadFromStream(AddrMan& addr, DataStream& ssPeers)
{
    DeserializeDB(ssPeers, addr, false);
}